

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

Module * __thiscall wabt::Script::GetModule(Script *this,Var *var)

{
  bool bVar1;
  Index IVar2;
  size_type sVar3;
  const_reference this_00;
  pointer base;
  ModuleCommand *pMVar4;
  ScriptModuleCommand *pSVar5;
  Command *command;
  Index index;
  Var *var_local;
  Script *this_local;
  
  IVar2 = BindingHash::FindIndex(&this->module_bindings,var);
  sVar3 = std::
          vector<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
          ::size(&this->commands);
  if (IVar2 < sVar3) {
    this_00 = std::
              vector<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
              ::operator[](&this->commands,(ulong)IVar2);
    base = std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>::get(this_00);
    bVar1 = isa<wabt::ModuleCommand,wabt::Command>(base);
    if (bVar1) {
      pMVar4 = cast<wabt::ModuleCommand,wabt::Command>(base);
      this_local = (Script *)&pMVar4->module;
    }
    else {
      bVar1 = isa<wabt::ScriptModuleCommand,wabt::Command>(base);
      if (bVar1) {
        pSVar5 = cast<wabt::ScriptModuleCommand,wabt::Command>(base);
        this_local = (Script *)&pSVar5->module;
      }
      else {
        this_local = (Script *)0x0;
      }
    }
  }
  else {
    this_local = (Script *)0x0;
  }
  return (Module *)this_local;
}

Assistant:

const Module* Script::GetModule(const Var& var) const {
  Index index = module_bindings.FindIndex(var);
  if (index >= commands.size()) {
    return nullptr;
  }
  auto* command = commands[index].get();
  if (isa<ModuleCommand>(command)) {
    return &cast<ModuleCommand>(command)->module;
  } else if (isa<ScriptModuleCommand>(command)) {
    return &cast<ScriptModuleCommand>(command)->module;
  }
  return nullptr;
}